

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_agree_hostkey(LIBSSH2_SESSION *session,size_t kex_flags,uchar *hostkey,size_t hostkey_len)

{
  bool bVar1;
  LIBSSH2_HOSTKEY_METHOD **methodlist;
  char *pcVar2;
  uchar *puVar3;
  LIBSSH2_HOSTKEY_METHOD *pLVar4;
  uchar *puVar5;
  LIBSSH2_SESSION *pLVar6;
  int iVar7;
  size_t sVar8;
  
  methodlist = libssh2_hostkey_methods();
  puVar5 = (uchar *)session->hostkey_prefs;
  pLVar6 = session;
  if (puVar5 == (uchar *)0x0) {
    iVar7 = -1;
    if (methodlist != (LIBSSH2_HOSTKEY_METHOD **)0x0) {
      pLVar4 = *methodlist;
      while (pLVar4 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
        methodlist = methodlist + 1;
        puVar5 = (uchar *)pLVar4->name;
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        sVar8 = strlen((char *)puVar5);
        puVar5 = kex_agree_instr(hostkey,hostkey_len,puVar5,sVar8);
        if (((puVar5 != (uchar *)0x0) &&
            (((kex_flags & 1) == 0 ||
             (pLVar4->encrypt !=
              (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_void_ptr_ptr
               *)0x0)))) &&
           (((kex_flags & 2) == 0 ||
            (pLVar4->sig_verify !=
             (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_size_t_uchar_ptr_size_t_void_ptr_ptr *)0x0))))
        {
          session->hostkey = pLVar4;
          return 0;
        }
        pLVar4 = *methodlist;
      }
    }
  }
  else {
    do {
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar5 == '\0') {
        return -1;
      }
      pcVar2 = strchr((char *)puVar5,0x2c);
      if (pcVar2 == (char *)0x0) {
        sVar8 = strlen((char *)puVar5);
      }
      else {
        sVar8 = (long)pcVar2 - (long)puVar5;
      }
      puVar3 = kex_agree_instr(hostkey,hostkey_len,puVar5,sVar8);
      if (puVar3 == (uchar *)0x0) {
LAB_00113fa4:
        puVar5 = (uchar *)(pcVar2 + 1);
        if (pcVar2 == (char *)0x0) {
          puVar5 = (uchar *)0x0;
        }
        bVar1 = true;
      }
      else {
        pLVar4 = (LIBSSH2_HOSTKEY_METHOD *)
                 kex_get_method_by_name((char *)puVar5,sVar8,(LIBSSH2_COMMON_METHOD **)methodlist);
        if (pLVar4 == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
          pLVar6 = (LIBSSH2_SESSION *)0xffffffff;
LAB_00113f9a:
          bVar1 = false;
        }
        else {
          if ((((kex_flags & 1) == 0) ||
              (pLVar4->encrypt !=
               (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_void_ptr_ptr
                *)0x0)) &&
             (((kex_flags & 2) == 0 ||
              (pLVar4->sig_verify !=
               (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_size_t_uchar_ptr_size_t_void_ptr_ptr *)0x0))
             )) {
            session->hostkey = pLVar4;
            pLVar6 = (LIBSSH2_SESSION *)0x0;
            goto LAB_00113f9a;
          }
          bVar1 = true;
        }
        if (bVar1) goto LAB_00113fa4;
        bVar1 = false;
      }
      iVar7 = (int)pLVar6;
    } while (bVar1);
  }
  return iVar7;
}

Assistant:

static int kex_agree_hostkey(LIBSSH2_SESSION * session,
                             size_t kex_flags,
                             unsigned char *hostkey, size_t hostkey_len)
{
    const LIBSSH2_HOSTKEY_METHOD **hostkeyp = libssh2_hostkey_methods();
    unsigned char *s;

    if(session->hostkey_prefs) {
        s = (unsigned char *) session->hostkey_prefs;

        while(s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));
            if(kex_agree_instr(hostkey, hostkey_len, s, method_len)) {
                const LIBSSH2_HOSTKEY_METHOD *method =
                    (const LIBSSH2_HOSTKEY_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           hostkeyp);

                if(!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                /* So far so good, but does it suit our purposes? (Encrypting
                   vs Signing) */
                if(((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_ENC_HOSTKEY) ==
                     0) || (method->encrypt)) {
                    /* Either this hostkey can do encryption or this kex just
                       doesn't require it */
                    if(((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_SIGN_HOSTKEY)
                         == 0) || (method->sig_verify)) {
                        /* Either this hostkey can do signing or this kex just
                           doesn't require it */
                        session->hostkey = method;
                        return 0;
                    }
                }
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while(hostkeyp && (*hostkeyp) && (*hostkeyp)->name) {
        s = kex_agree_instr(hostkey, hostkey_len,
                            (unsigned char *) (*hostkeyp)->name,
                            strlen((*hostkeyp)->name));
        if(s) {
            /* So far so good, but does it suit our purposes? (Encrypting vs
               Signing) */
            if(((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_ENC_HOSTKEY) == 0) ||
                ((*hostkeyp)->encrypt)) {
                /* Either this hostkey can do encryption or this kex just
                   doesn't require it */
                if(((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_SIGN_HOSTKEY) ==
                     0) || ((*hostkeyp)->sig_verify)) {
                    /* Either this hostkey can do signing or this kex just
                       doesn't require it */
                    session->hostkey = *hostkeyp;
                    return 0;
                }
            }
        }
        hostkeyp++;
    }

    return -1;
}